

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O2

void Col_MListRemove(Col_Word mlist,size_t first,size_t last)

{
  Col_Word *nodePtr;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  Col_Word CVar4;
  Col_Word right;
  ulong first_00;
  ulong last_00;
  ulong uVar5;
  byte *node;
  Col_Word tail;
  byte *local_40;
  byte *local_38;
  
  if (last < first) {
    return;
  }
  nodePtr = (Col_Word *)(mlist + 0x10);
  node = *(byte **)(mlist + 0x10);
  local_40 = node;
  sVar2 = Col_ListLength(mlist);
  sVar3 = Col_ListLoopLength(mlist);
  uVar5 = sVar2 - sVar3;
  if (uVar5 == 0 && sVar3 != 0) {
    if (first == 0) {
      CVar4 = Col_Sublist((ulong)node & 0xfffffffffffffff7,last % sVar2 + 1,sVar2 - 1);
      right = Col_Sublist((ulong)node & 0xfffffffffffffff7,0,last % sVar2);
      local_40 = (byte *)NewMConcatList(CVar4,right);
    }
    else {
      first_00 = first % sVar2;
      uVar5 = first_00;
      if (first_00 == 0) {
        uVar5 = sVar2;
      }
      last_00 = last % sVar2;
      if (last_00 < uVar5) {
        CVar4 = Col_Sublist(mlist,0,last_00);
        local_40 = (byte *)((ulong)node & 0xfffffffffffffff7);
        if (first_00 != 0) {
          MListRemove((Col_Word *)&local_40,first_00,sVar2 - 1);
        }
        MListRemove((Col_Word *)&local_40,0,last_00);
        CVar4 = NewMConcatList(CVar4,(ulong)local_40 | 8);
        goto LAB_0010ff30;
      }
      local_40 = (byte *)((ulong)node & 0xfffffffffffffff7);
      MListRemove((Col_Word *)&local_40,uVar5,last_00);
    }
    CVar4 = (ulong)local_40 | 8;
LAB_0010ff30:
    *nodePtr = CVar4;
    return;
  }
  if (sVar3 == 0) {
    if (sVar2 <= first) {
      return;
    }
    sVar3 = sVar2 - 1;
    if (last < sVar2) {
      sVar3 = last;
    }
    MListRemove(nodePtr,first,sVar3);
    return;
  }
  if (node == (byte *)0x0) {
LAB_0010ff56:
    ConvertToMConcatNode((Col_Word *)&local_40);
    *nodePtr = (Col_Word)local_40;
    node = local_40;
  }
  else {
    if (((ulong)node & 0xf) == 0) {
      if ((*node & 2) == 0) goto LAB_0010ff56;
      uVar1 = *node & 0xfffffffe;
    }
    else {
      uVar1 = immediateWordTypes[(uint)node & 0x1f];
    }
    if (uVar1 != 0x26) goto LAB_0010ff56;
  }
  if (uVar5 - 1 <= last && first == 0) {
    *nodePtr = *(Col_Word *)(node + 0x18);
    if (last < uVar5) {
      return;
    }
    Col_MListRemove(mlist,0,last - uVar5);
    return;
  }
  if (last < uVar5) {
    MListRemove((Col_Word *)(node + 0x10),first,last);
    goto LAB_0011006d;
  }
  sVar2 = first - uVar5;
  if (first < uVar5) {
    MListRemove((Col_Word *)(node + 0x10),first,uVar5 - 1);
    sVar2 = 0;
  }
  *(undefined8 *)(mlist + 0x10) = *(undefined8 *)(node + 0x18);
  Col_MListRemove(mlist,sVar2,last - uVar5);
  local_38 = *(byte **)(mlist + 0x10);
  if (((ulong)local_38 & 0xf) == 0) {
    if ((local_38 != (byte *)0x0) && ((*local_38 & 2) != 0)) {
      uVar1 = *local_38 & 0xfffffffe;
      goto LAB_0011002a;
    }
LAB_0011002f:
    ConvertToMConcatNode((Col_Word *)&local_38);
LAB_0011003f:
    *(undefined8 *)(node + 0x18) = *(undefined8 *)(local_38 + 0x18);
    *(undefined8 *)(local_38 + 0x18) = *(undefined8 *)(local_38 + 0x10);
    *(undefined8 *)(local_38 + 0x10) = *(undefined8 *)(node + 0x10);
    *(byte **)(node + 0x10) = local_38;
    UpdateMConcatNode((Col_Word)local_38);
  }
  else {
    if ((0x11000100U >> ((uint)local_38 & 0x1f) & 1) == 0) {
      uVar1 = immediateWordTypes[(uint)local_38 & 0x1f];
LAB_0011002a:
      if (uVar1 != 0x26) goto LAB_0011002f;
      goto LAB_0011003f;
    }
    *(byte **)(node + 0x18) = local_38;
  }
  *nodePtr = (Col_Word)node;
LAB_0011006d:
  UpdateMConcatNode((Col_Word)node);
  return;
}

Assistant:

void
Col_MListRemove(
    Col_Word mlist, /*!< Mutable list to remove sequence from. */
    size_t first,   /*!< Index of first element in range to remove. */
    size_t last)    /*!< Index of last element in range to remove. */
{
    size_t length, loop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    if (first > last) {
        /*
         * No-op.
         */

        return;
    }

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    length = Col_ListLength(mlist);
    loop = Col_ListLoopLength(mlist);
    if (loop && length == loop) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);

        if (first == 0) {
            /*
             * Rotate loop.
             */

            last %= loop;
            root = WORD_CIRCLIST_CORE(root);
            root = NewMConcatList(
                Col_Sublist(root, last+1, length-1),
                Col_Sublist(root, 0, last));
            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
        } else {
            /*
             * Remove middle of loop.
             */

            first %= loop;
            if (first == 0) first = loop;
            last %= loop;

            if (last < first) {
                /*
                 * Keep inner part of loop and use beginning as head.
                 */

                Col_Word head, node;

                head = Col_Sublist(mlist, 0, last);
                root = WORD_CIRCLIST_CORE(root);
                if (first < length) {
                    MListRemove(&root, first, length-1);
                }
                MListRemove(&root, 0, last);

                node = NewMConcatList(head, WORD_CIRCLIST_NEW(root));
                WORD_WRAP_SOURCE(mlist) = node;
            } else {
                /*
                 * Remove inner part of loop.
                 */

                root = WORD_CIRCLIST_CORE(root);
                MListRemove(&root, first, last);
                WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_NEW(root);
            }
        }
        return;
    } else if (loop) {
        /*
         * List is cyclic.
         */

        if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
            ConvertToMConcatNode(&root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (first == 0 && last >= length-loop-1) {
            /*
             * Remove whole head and recurse on tail.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            if (last >= length-loop) {
                Col_MListRemove(mlist, 0, last - (length-loop));
            }
            return;
        }

        if (last < length-loop) {
            /*
             * Remove within head.
             */

            MListRemove(&WORD_CONCATLIST_LEFT(root), first, last);
        } else {
            /*
             * Remove part of tail.
             */

            Col_Word tail;

            if (first >= length-loop) {
                first -= length-loop;
                last -= length-loop;
            } else {
                /*
                 * Remove end of head first.
                 */

                MListRemove(&WORD_CONCATLIST_LEFT(root), first, length-loop-1);
                first = 0;
                last -= length-loop;
            }

            /*
             *  Temporarily use tail as root before recursive call.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListRemove(mlist, first, last);
            tail = WORD_WRAP_SOURCE(mlist);
            if (WORD_TYPE(tail) != WORD_TYPE_CIRCLIST) {
                /*
                 * Circular list was made cyclic in the process. Move head to
                 * left.
                 */

                if (WORD_TYPE(tail) != WORD_TYPE_MCONCATLIST) {
                    ConvertToMConcatNode(&tail);
                }
                ASSERT(WORD_TYPE(tail) == WORD_TYPE_MCONCATLIST);
                WORD_CONCATLIST_RIGHT(root) = WORD_CONCATLIST_RIGHT(tail);
                WORD_CONCATLIST_RIGHT(tail) = WORD_CONCATLIST_LEFT(tail);
                WORD_CONCATLIST_LEFT(tail) = WORD_CONCATLIST_LEFT(root);
                WORD_CONCATLIST_LEFT(root) = tail;
                UpdateMConcatNode(tail);
            } else {
                WORD_CONCATLIST_RIGHT(root) = tail;
            }

            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

            /*
             * Restore root.
             */

            WORD_WRAP_SOURCE(mlist) = root;
        }
        UpdateMConcatNode(root);
        return;
    }

    /*
     * Acyclic list.
     */

    if (length == 0 || first >= length) {
        /*
         * No-op.
         */

        return;
    }

    if (last >= length) {
        last = length-1;
    }

    /*
     * General case.
     */

    MListRemove(&WORD_WRAP_SOURCE(mlist), first, last);
}